

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_create.c
# Opt level: O3

mpt_metatype * mpt_iterator_create(char *conf)

{
  char cVar1;
  ushort uVar2;
  ushort *puVar3;
  char *pcVar4;
  int iVar5;
  ushort **ppuVar6;
  int *piVar7;
  mpt_metatype *pmVar8;
  size_t sVar9;
  size_t __n;
  char buf [32];
  char *local_50;
  mpt_value local_48;
  char local_38 [32];
  
  if ((conf == (char *)0x0) || (cVar1 = *conf, (long)cVar1 == 0)) {
LAB_00108c20:
    pmVar8 = _mpt_iterator_range((mpt_value *)0x0);
    return pmVar8;
  }
  ppuVar6 = __ctype_b_loc();
  puVar3 = *ppuVar6;
  uVar2 = puVar3[cVar1];
  if ((uVar2 >> 0xd & 1) != 0) {
    pcVar4 = conf + 1;
    do {
      local_50 = pcVar4;
      if ((long)*local_50 == 0) goto LAB_00108c20;
      uVar2 = puVar3[*local_50];
      conf = local_50;
      pcVar4 = local_50 + 1;
    } while ((uVar2 >> 0xd & 1) != 0);
  }
  if ((uVar2 & 0x300) != 0) {
    __n = 0xffffffffffffffff;
    do {
      sVar9 = __n;
      __n = sVar9 + 1;
    } while ((*(byte *)((long)puVar3 + (long)conf[sVar9 + 1] * 2 + 1) & 3) != 0);
    if (sVar9 + 2 < 0x20) {
      if (__n == 0xffffffffffffffff) goto LAB_00108cfc;
      memcpy(local_38,conf,__n);
      local_38[sVar9 + 1] = '\0';
      local_50 = conf + __n;
      local_48._addr = &local_50;
      local_48._type = 0x73;
      iVar5 = strcasecmp(local_38,"linear");
      if ((iVar5 == 0) || (iVar5 = strcasecmp(local_38,"lin"), iVar5 == 0)) {
        pmVar8 = _mpt_iterator_linear(&local_48);
        return pmVar8;
      }
      iVar5 = strcasecmp(local_38,"factor");
      if (((iVar5 == 0) || (iVar5 = strcasecmp(local_38,"fact"), iVar5 == 0)) ||
         (iVar5 = strcasecmp(local_38,"fac"), iVar5 == 0)) {
        pmVar8 = _mpt_iterator_factor(&local_48);
        return pmVar8;
      }
      iVar5 = strcasecmp(local_38,"range");
      if (iVar5 == 0) {
        pmVar8 = _mpt_iterator_range(&local_48);
        return pmVar8;
      }
    }
    piVar7 = __errno_location();
    *piVar7 = 0x16;
    return (mpt_metatype *)0x0;
  }
LAB_00108cfc:
  pmVar8 = mpt_iterator_values(conf);
  return pmVar8;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_create(const char *conf)
{
	MPT_STRUCT(value) val = MPT_VALUE_INIT(0, 0);
	size_t len;
	char buf[32];
	char curr;
	
	if (!conf) {
		return _mpt_iterator_range(0);
	}
	/* consume whitespace */
	while (*conf && isspace(*conf)) {
		conf++;
	}
	if (!(curr = *conf)) {
		return _mpt_iterator_range(0);
	}
	/* extract description string */
	len = 0;
	while ((isupper(curr) || islower(curr))) {
		curr = conf[len++];
	}
	if (len >= sizeof(buf)) {
		errno = EINVAL;
		return 0;
	}
	/* no description -> use normal values */
	if (!len--) {
		return mpt_iterator_values(conf);
	}
	
	memcpy(buf, conf, len);
	buf[len] = 0;
	
	conf += len;
	MPT_value_set(&val, 's', &conf);
	
	/* create matching iterators */
	if (!strcasecmp(buf, "linear")
	 || !strcasecmp(buf, "lin")) {
		return _mpt_iterator_linear(&val);
	}
	if (!strcasecmp(buf, "factor")
	 || !strcasecmp(buf, "fact")
	 || !strcasecmp(buf, "fac")) {
		return _mpt_iterator_factor(&val);
	}
	if (!strcasecmp(buf, "range")) {
		return _mpt_iterator_range(&val);
	}
	/* unknown value iterator type */
	errno = EINVAL;
	return 0;
}